

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

uint32_t __thiscall xatlas::internal::Mesh::findEdge(Mesh *this,uint32_t vertex0,uint32_t vertex1)

{
  bool bVar1;
  uint current;
  uint32_t current_00;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  ColocalVertexIterator it0;
  ColocalVertexIterator it1;
  EdgeKey key;
  ColocalVertexIterator local_60;
  uint32_t local_4c;
  ColocalVertexIterator local_48;
  EdgeKey local_38;
  
  if ((this->m_nextColocalVertex).m_base.size == 0) {
    local_60.m_mesh = (Mesh *)CONCAT44(vertex1,vertex0);
    current_00 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                 ::get(&this->m_edgeMap,(EdgeKey *)&local_60);
    if (current_00 != 0xffffffff) {
      uVar4 = 0xffffffff;
      do {
        bVar1 = isFaceIgnored(this,current_00 / 3);
        if (!bVar1) {
          uVar4 = current_00;
        }
        current_00 = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                     ::getNext(&this->m_edgeMap,current_00);
      } while (current_00 != 0xffffffff);
      return uVar4;
    }
  }
  else {
    local_60.m_first = 0xffffffff;
    if (vertex0 != 0xffffffff) {
      uVar3 = 0xffffffff;
      local_60.m_mesh = this;
      local_60.m_current = vertex0;
      local_4c = vertex1;
      do {
        local_48.m_first = 0xffffffff;
        local_48.m_mesh = this;
        local_48.m_current = local_4c;
        if (local_4c != 0xffffffff) {
          do {
            local_38.v0 = local_60.m_current;
            local_38.v1 = local_48.m_current;
            current = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                      ::get(&this->m_edgeMap,&local_38);
            while (current != 0xffffffff) {
              bVar1 = isFaceIgnored(this,current / 3);
              uVar2 = uVar3;
              if (((!bVar1) && (uVar2 = current, this->m_id == 0xffffffff)) && (uVar3 != 0xffffffff)
                 ) {
                __assert_fail("m_id != (4294967295U) || (m_id == (4294967295U) && result == (4294967295U))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                              ,0xacf,
                              "uint32_t xatlas::internal::Mesh::findEdge(uint32_t, uint32_t) const")
                ;
              }
              current = HashMap<xatlas::internal::Mesh::EdgeKey,_xatlas::internal::Mesh::EdgeHash,_xatlas::internal::Equal<xatlas::internal::Mesh::EdgeKey>_>
                        ::getNext(&this->m_edgeMap,current);
              uVar3 = uVar2;
            }
            ColocalVertexIterator::advance(&local_48);
          } while (local_48.m_first != local_48.m_current);
        }
        ColocalVertexIterator::advance(&local_60);
        if (local_60.m_first == local_60.m_current) {
          return uVar3;
        }
      } while( true );
    }
  }
  return 0xffffffff;
}

Assistant:

uint32_t findEdge(uint32_t vertex0, uint32_t vertex1) const
	{
		uint32_t result = UINT32_MAX;
		if (m_nextColocalVertex.isEmpty()) {
			EdgeKey key(vertex0, vertex1);
			uint32_t edge = m_edgeMap.get(key);
			while (edge != UINT32_MAX) {
				// Don't find edges of ignored faces.
				if (!isFaceIgnored(meshEdgeFace(edge))) {
					//XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
					result = edge;
#if !XA_DEBUG
					return result;
#endif
				}
				edge = m_edgeMap.getNext(edge);
			}
		} else {
			for (ColocalVertexIterator it0(this, vertex0); !it0.isDone(); it0.advance()) {
				for (ColocalVertexIterator it1(this, vertex1); !it1.isDone(); it1.advance()) {
					EdgeKey key(it0.vertex(), it1.vertex());
					uint32_t edge = m_edgeMap.get(key);
					while (edge != UINT32_MAX) {
						// Don't find edges of ignored faces.
						if (!isFaceIgnored(meshEdgeFace(edge))) {
							XA_DEBUG_ASSERT(m_id != UINT32_MAX || (m_id == UINT32_MAX && result == UINT32_MAX)); // duplicate edge - ignore on initial meshes
							result = edge;
#if !XA_DEBUG
							return result;
#endif
						}
						edge = m_edgeMap.getNext(edge);
					}
				}
			}
		}
		return result;
	}